

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_core_ll.c
# Opt level: O0

int IoTHubClientCore_LL_GetTransportCallbacks(TRANSPORT_CALLBACKS_INFO *transport_cb)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  TRANSPORT_CALLBACKS_INFO *transport_cb_local;
  
  if (transport_cb == (TRANSPORT_CALLBACKS_INFO *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_core_ll.c"
                ,"IoTHubClientCore_LL_GetTransportCallbacks",0xcdd,1,
                "Invalid parameter transport callback can not be NULL");
    }
    l._4_4_ = 0xcde;
  }
  else {
    transport_cb->send_complete_cb = IoTHubClientCore_LL_SendComplete;
    transport_cb->twin_retrieve_prop_complete_cb = IoTHubClientCore_LL_RetrievePropertyComplete;
    transport_cb->twin_rpt_state_complete_cb = IoTHubClientCore_LL_ReportedStateComplete;
    transport_cb->connection_status_cb = IoTHubClientCore_LL_ConnectionStatusCallBack;
    transport_cb->prod_info_cb = IoTHubClientCore_LL_GetProductInfo;
    transport_cb->msg_input_cb = IoTHubClientCore_LL_MessageCallbackFromInput;
    transport_cb->msg_cb = IoTHubClientCore_LL_MessageCallback;
    transport_cb->method_complete_cb = IoTHubClientCore_LL_DeviceMethodComplete;
    transport_cb->get_model_id_cb = IoTHubClientCore_LL_GetModelId;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int IoTHubClientCore_LL_GetTransportCallbacks(TRANSPORT_CALLBACKS_INFO* transport_cb)
{
    int result;
    if (transport_cb == NULL)
    {
        LogError("Invalid parameter transport callback can not be NULL");
        result = MU_FAILURE;
    }
    else
    {
        transport_cb->send_complete_cb = IoTHubClientCore_LL_SendComplete;
        transport_cb->twin_retrieve_prop_complete_cb = IoTHubClientCore_LL_RetrievePropertyComplete;
        transport_cb->twin_rpt_state_complete_cb = IoTHubClientCore_LL_ReportedStateComplete;
        transport_cb->connection_status_cb = IoTHubClientCore_LL_ConnectionStatusCallBack;
        transport_cb->prod_info_cb = IoTHubClientCore_LL_GetProductInfo;
        transport_cb->msg_input_cb = IoTHubClientCore_LL_MessageCallbackFromInput;
        transport_cb->msg_cb = IoTHubClientCore_LL_MessageCallback;
        transport_cb->method_complete_cb = IoTHubClientCore_LL_DeviceMethodComplete;
        transport_cb->get_model_id_cb = IoTHubClientCore_LL_GetModelId;
        result = 0;
    }
    return result;
}